

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O2

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
rest_rpc::rpc_service::msgpack_codec::unpack<std::tuple<std::__cxx11::string,std::__cxx11::string>>
          (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,msgpack_codec *this,char *data,size_t length)

{
  unpack_limit local_40;
  
  local_40.array_ = 0xffffffff;
  local_40.map_ = 0xffffffff;
  local_40.str_ = 0xffffffff;
  local_40.bin_ = 0xffffffff;
  local_40.ext_ = 0xffffffff;
  local_40.depth_ = 0xffffffff;
  msgpack::v3::unpack(&this->msg_,data,length,(unpack_reference_func)0x0,(void *)0x0,&local_40);
  msgpack::v1::object::as<std::tuple<std::__cxx11::string,std::__cxx11::string>>
            (__return_storage_ptr__,(object *)this);
  return __return_storage_ptr__;
}

Assistant:

T unpack(char const *data, size_t length) {
    try {
      msgpack::unpack(msg_, data, length);
      return msg_.get().as<T>();
    } catch (...) {
      throw std::invalid_argument("unpack failed: Args not match!");
    }
  }